

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_DRAIN_MANA(effect_handler_context_t_conflict *context)

{
  byte *pbVar1;
  uint32_t *puVar2;
  short sVar3;
  anon_enum_32 aVar4;
  player *ppVar5;
  _Bool _Var6;
  wchar_t timer;
  monster *mon;
  loc grid;
  monster_conflict *mon_00;
  wchar_t wVar7;
  short sVar8;
  char m_name [80];
  char acStack_88 [88];
  
  timer = effect_calculate_value(context,false);
  aVar4 = (context->origin).what;
  mon = monster_target_monster(context);
  grid = cave_find_decoy(cave);
  context->ident = true;
  if (aVar4 == SRC_TRAP) {
    mon_00 = (monster_conflict *)0x0;
  }
  else {
    if ((context->origin).what != SRC_MONSTER) {
      __assert_fail("context->origin.what == SRC_MONSTER",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                    ,0x3c7,"_Bool effect_handler_DRAIN_MANA(effect_handler_context_t *)");
    }
    mon_00 = (monster_conflict *)cave_monster(cave,(context->origin).which.monster);
    monster_desc(acStack_88,0x50,(monster *)mon_00,L'̔');
  }
  ppVar5 = player;
  if (mon == (monster *)0x0) {
    if (grid.x == L'\0' || (ulong)grid >> 0x20 == 0) {
      wVar7 = (wchar_t)player->csp;
      if (wVar7 == L'\0') {
        msg("The draining fails.");
        if (aVar4 != SRC_TRAP) {
          update_smart_learn(mon_00,player,L'\0',L'\n',L'\xffffffff');
        }
      }
      else {
        if (timer < wVar7) {
          player->csp = player->csp - (short)timer;
          wVar7 = timer;
        }
        else {
          ppVar5->csp = 0;
          ppVar5->csp_frac = 0;
        }
        if (aVar4 != SRC_TRAP) {
          sVar3 = mon_00->maxhp;
          if (mon_00->hp < sVar3) {
            sVar8 = mon_00->hp + (short)wVar7 * 6;
            if (sVar3 <= sVar8) {
              sVar8 = sVar3;
            }
            mon_00->hp = sVar8;
            if ((monster_conflict *)ppVar5->upkeep->health_who == mon_00) {
              pbVar1 = (byte *)((long)&ppVar5->upkeep->redraw + 1);
              *pbVar1 = *pbVar1 | 2;
            }
            _Var6 = monster_is_visible((monster *)mon_00);
            if (_Var6) {
              msg("%s appears healthier.",acStack_88);
            }
          }
        }
        puVar2 = &player->upkeep->redraw;
        *puVar2 = *puVar2 | 0x80;
      }
    }
    else {
      square_destroy_decoy(cave,grid);
    }
  }
  else {
    if (timer < L'\x01') {
      timer = L'\0';
    }
    mon_inc_timed(mon,L'\a',timer,L'\0');
  }
  return true;
}

Assistant:

bool effect_handler_DRAIN_MANA(effect_handler_context_t *context)
{
	int drain = effect_calculate_value(context, false);
	bool monster = context->origin.what != SRC_TRAP;
	char m_name[80];
	struct monster *mon = NULL;
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	if (monster) {
		assert(context->origin.what == SRC_MONSTER);

		mon = cave_monster(cave, context->origin.which.monster);

		/* Get the monster name (or "it") */
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
	}

	/* Target is another monster - disenchant it */
	if (t_mon) {
		mon_inc_timed(t_mon, MON_TMD_DISEN, MAX(drain, 0), 0);
		return true;
	}

	/* Target was a decoy - destroy it */
	if (decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* The player has no mana */
	if (!player->csp) {
		msg("The draining fails.");
		if (monster) {
			update_smart_learn(mon, player, 0, PF_NO_MANA, -1);
		}
		return true;
	}

	/* Drain the given amount if the player has that much, or all of it */
	if (drain >= player->csp) {
		drain = player->csp;
		player->csp = 0;
		player->csp_frac = 0;
	} else {
		player->csp -= drain;
	}

	/* Heal the monster */
	if (monster) {
		if (mon->hp < mon->maxhp) {
			mon->hp += (6 * drain);
			if (mon->hp > mon->maxhp)
				mon->hp = mon->maxhp;

			/* Redraw (later) if needed */
			if (player->upkeep->health_who == mon)
				player->upkeep->redraw |= (PR_HEALTH);

			/* Special message */
			if (monster_is_visible(mon))
				msg("%s appears healthier.", m_name);
		}
	}

	/* Redraw mana */
	player->upkeep->redraw |= PR_MANA;

	return true;
}